

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result spvc_compiler_set_entry_point(spvc_compiler compiler,char *name,SpvExecutionModel model)

{
  char *pcVar1;
  pointer this;
  exception *e;
  allocator local_49;
  string local_48;
  ExecutionModel local_24;
  char *pcStack_20;
  SpvExecutionModel model_local;
  char *name_local;
  spvc_compiler compiler_local;
  
  local_24 = model;
  pcStack_20 = name;
  name_local = (char *)compiler;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
  spirv_cross::Compiler::set_entry_point(this,&local_48,local_24);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_set_entry_point(spvc_compiler compiler, const char *name, SpvExecutionModel model)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		compiler->compiler->set_entry_point(name, static_cast<spv::ExecutionModel>(model));
	}